

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void WriteIndentChar(TidyDocImpl *doc)

{
  uint uVar1;
  ulong uVar2;
  int spaces;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint c;
  bool bVar6;
  
  uVar1 = (doc->pprint).indent[0].spaces;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = uVar1;
  }
  uVar2 = (doc->config).value[0x53].v;
  uVar4 = (uint)uVar2;
  if ((uVar4 != 0 & 0 < (int)uVar1 & indent_char) == 1) {
    uVar3 = (ulong)uVar5;
    bVar6 = uVar5 < uVar4;
    uVar5 = 1;
    if (bVar6) goto LAB_0014e256;
    uVar5 = (uint)(uVar3 / (uVar2 & 0xffffffff));
  }
  if (uVar5 == 0) {
    return;
  }
LAB_0014e256:
  do {
    c = 0x20;
    if (indent_char != 0) {
      c = 9;
    }
    prvTidyWriteChar(c,doc->docOut);
    uVar5 = uVar5 - 1;
  } while (uVar5 != 0);
  return;
}

Assistant:

static void WriteIndentChar(TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;
    uint i;
    uint spaces = GetSpaces(pprint);
    uint tabsize = cfg(doc, TidyTabSize);
    if (spaces && (indent_char == '\t') && tabsize)
    {
        spaces /= tabsize;  // set number of tabs to output
        if (spaces == 0)    // with a minimum of one
            spaces = 1;
    }
    for (i = 0; i < spaces; i++)
        TY_(WriteChar)(indent_char, doc->docOut); /* 20150515 - Issue #108 */

}